

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_error_params.cc
# Opt level: O3

unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>
bssl::CreateCertErrorParams2Der(char *name1,Input der1,char *name2,Input der2)

{
  Input der2_00;
  CertErrorParams2Der *this;
  Input der1_00;
  uchar *in_stack_00000010;
  size_t in_stack_ffffffffffffffc0;
  
  der1_00.data_.data_ = (uchar *)der1.data_.size_;
  if ((der1.data_.data_ != (uchar *)0x0) && (der2.data_.data_ != (uchar *)0x0)) {
    this = (CertErrorParams2Der *)operator_new(0x58);
    der2_00.data_.size_ = in_stack_ffffffffffffffc0;
    der2_00.data_.data_ = in_stack_00000010;
    der1_00.data_.size_ = (size_t)name2;
    anon_unknown_0::CertErrorParams2Der::CertErrorParams2Der
              (this,(char *)der1.data_.data_,der1_00,(char *)der2.data_.data_,der2_00);
    *(CertErrorParams2Der **)name1 = this;
    return (__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
            )(__uniq_ptr_data<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>,_true,_true>
              )name1;
  }
  abort();
}

Assistant:

std::unique_ptr<CertErrorParams> CreateCertErrorParams2Der(const char *name1,
                                                           der::Input der1,
                                                           const char *name2,
                                                           der::Input der2) {
  BSSL_CHECK(name1);
  BSSL_CHECK(name2);
  return std::make_unique<CertErrorParams2Der>(name1, der1, name2, der2);
}